

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_23da7e::generatePixel(int i,int j,half *rgbaValue,bool pIsLeft)

{
  short sVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  unsigned_short uVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  
  fVar11 = (float)j;
  if ((int)CONCAT71(in_register_00000009,pIsLeft) == 0) {
    fVar7 = fVar11 * 0.005 + (float)((j * i) % 10);
    uVar4 = i * 2;
    uVar6 = i * i + j;
    iVar8 = (int)((ulong)uVar4 * 0x66666667 >> 0x20) - (-(uint)((int)uVar4 < 0) & 0x66666667);
    iVar9 = (int)((ulong)uVar6 * 0x66666667 >> 0x20) - (-(uint)((int)uVar6 < 0) & 0x66666667);
    iVar8 = uVar4 + ((iVar8 >> 2) - (iVar8 >> 0x1f)) * -10;
    iVar9 = uVar6 + ((iVar9 >> 2) - (iVar9 >> 0x1f)) * -10;
    fVar10 = 0.007;
    fVar3 = 0.006;
  }
  else {
    fVar7 = fVar11 * 0.004 + (float)((j + i) % 10);
    uVar4 = j * 2;
    uVar6 = j * j + i;
    iVar8 = (int)((ulong)uVar4 * 0x66666667 >> 0x20) - (-(uint)((int)uVar4 < 0) & 0x66666667);
    iVar9 = (int)((ulong)uVar6 * 0x66666667 >> 0x20) - (-(uint)((int)uVar6 < 0) & 0x66666667);
    iVar8 = uVar4 + ((iVar8 >> 2) - (iVar8 >> 0x1f)) * -10;
    iVar9 = uVar6 + ((iVar9 >> 2) - (iVar9 >> 0x1f)) * -10;
    fVar10 = 0.006;
    fVar3 = 0.003;
  }
  fVar2 = *(float *)((long)&half::_toFloat + (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4);
  fVar10 = ((float)i * fVar10 + (float)iVar8) / 10.0;
  fVar7 = fVar7 / 10.0;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar7 >> 0x17) * 2);
    if (sVar1 == 0) {
      uVar5 = half::convert((int)fVar7);
    }
    else {
      uVar5 = sVar1 + (short)(((uint)fVar7 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd);
    }
  }
  else {
    uVar5 = (unsigned_short)((uint)fVar7 >> 0x10);
  }
  fVar11 = (fVar11 * fVar3 + (float)iVar9) / 10.0;
  rgbaValue->_h = uVar5;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
    if (sVar1 == 0) {
      uVar5 = half::convert((int)fVar10);
    }
    else {
      uVar5 = sVar1 + (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
    }
  }
  else {
    uVar5 = (unsigned_short)((uint)fVar10 >> 0x10);
  }
  rgbaValue[1]._h = uVar5;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar11 >> 0x17) * 2);
    if (sVar1 == 0) {
      uVar5 = half::convert((int)fVar11);
    }
    else {
      uVar5 = sVar1 + (short)(((uint)fVar11 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
    }
  }
  else {
    uVar5 = (unsigned_short)((uint)fVar11 >> 0x10);
  }
  rgbaValue[2]._h = uVar5;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar2 >> 0x17) * 2);
    if (sVar1 == 0) {
      uVar5 = half::convert((int)fVar2);
    }
    else {
      uVar5 = sVar1 + (short)(((uint)fVar2 & 0x7fffff) + 0xfff +
                              (uint)(((uint)fVar2 >> 0xd & 1) != 0) >> 0xd);
    }
  }
  else {
    uVar5 = (unsigned_short)((uint)fVar2 >> 0x10);
  }
  rgbaValue[3]._h = uVar5;
  return;
}

Assistant:

void
generatePixel (int i, int j, half* rgbaValue, bool pIsLeft)
{
    float redValue = 0.0f;
    float greenValue = 0.0f;
    float blueValue = 0.0f;
    float alphaValue = 0.0f;

    // These formulas are arbitrary but generate results that vary
    // depending on pixel position.  They are used to validate that
    // pixels are read/written correctly, because if we had only one
    // value for the whole image, the tests would still pass if we read
    // only one pixel and copied it all across the buffer.
    if(pIsLeft)
    {
        redValue = ((i + j) % 10 + 0.004f * j) / 10.0f;
        greenValue = ((j + j) % 10 + 0.006f * i) / 10.0f;
        blueValue = ((j * j + i) % 10 + 0.003f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }
    else
    {
        redValue = ((i * j) % 10 + 0.005f * j) / 10.0f;
        greenValue = ((i + i) % 10 + 0.007f * i) / 10.0f;
        blueValue = ((i * i + j) % 10 + 0.006f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }


    rgbaValue[0] = redValue;
    rgbaValue[1] = greenValue;
    rgbaValue[2] = blueValue;
    rgbaValue[3] = alphaValue;
}